

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.hpp
# Opt level: O3

void trial::protocol::serialization::
     save_overloader<trial::protocol::bintoken::oarchive,_std::set<int,_std::less<int>,_std::allocator<int>_>,_void>
     ::save(oarchive *ar,set<int,_std::less<int>,_std::allocator<int>_> *data,uint protocol_version)

{
  writer *self;
  char cVar1;
  _Rb_tree_node_base *p_Var2;
  
  self = &ar->writer;
  bintoken::basic_writer<16UL>::overloader<trial::protocol::bintoken::token::begin_array,_void>::
  value(self);
  cVar1 = (**(code **)(*(long *)&(ar->writer).encoder.storage + 0x10))(self,1);
  if (cVar1 != '\0') {
    (**(code **)(*(long *)&(self->encoder).storage + 0x18))(self,0x82);
  }
  for (p_Var2 = (data->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(data->_M_t)._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    boost::archive::detail::basic_oarchive::end_preamble();
    bintoken::basic_writer<16UL>::overloader<int,_void>::value(self,p_Var2[1]._M_color);
  }
  bintoken::basic_writer<16UL>::overloader<trial::protocol::bintoken::token::end_array,_void>::value
            (self);
  return;
}

Assistant:

static void save(protocol::bintoken::oarchive& ar,
                     const std::set<Key, Compare, Allocator>& data,
                     const unsigned int protocol_version)
    {
        ar.save<bintoken::token::begin_array>();
        ar.save<bintoken::token::null>();
        for (typename std::set<Key, Compare, Allocator>::const_iterator it = data.begin();
             it != data.end();
             ++it)
        {
            ar.save_override(*it, protocol_version);
        }
        ar.save<bintoken::token::end_array>();
    }